

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O0

void __thiscall deqp::SubcaseBase::SubcaseBase(SubcaseBase *this)

{
  SubcaseBase *this_local;
  
  GLWrapper::GLWrapper(&this->super_GLWrapper);
  (this->super_GLWrapper)._vptr_GLWrapper = (_func_int **)&PTR__SubcaseBase_03276e10;
  return;
}

Assistant:

SubcaseBase::SubcaseBase()
{
}